

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

bool __thiscall
Js::ProbeContainer::GetNextUserStatementOffsetForAdvance
          (ProbeContainer *this,FunctionBody *functionBody,ByteCodeReader *reader,int currentOffset,
          int *nextStatementOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggerScope *this_00;
  int nextStmOffset;
  undefined **this_01;
  int currentOffset_00;
  
  this_01 = &PTR_013e5f18;
  puVar3 = (undefined4 *)__tls_get_addr();
  currentOffset_00 = currentOffset;
  while( true ) {
    bVar2 = GetNextUserStatementOffsetHelper
                      ((ProbeContainer *)this_01,functionBody,currentOffset_00,SAT_FromCurrentToNext
                       ,nextStatementOffset);
    if ((!bVar2) ||
       ((this_00 = FunctionBody::GetDiagCatchScopeObjectAt(functionBody,currentOffset_00),
        this_00 != (DebuggerScope *)0x0 &&
        (bVar2 = DebuggerScope::IsOffsetInScope(this_00,*nextStatementOffset), !bVar2)))) {
      return false;
    }
    nextStmOffset = *nextStatementOffset;
    if (nextStmOffset <= currentOffset_00) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                  ,0x2c6,"(currentOffset < *nextStatementOffset)",
                                  "currentOffset < *nextStatementOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      nextStmOffset = *nextStatementOffset;
    }
    this_01 = (undefined **)functionBody;
    bVar2 = IsTmpRegCountIncreased(functionBody,reader,currentOffset,nextStmOffset,true);
    if (!bVar2) break;
    currentOffset_00 = *nextStatementOffset;
  }
  return true;
}

Assistant:

bool ProbeContainer::GetNextUserStatementOffsetForAdvance(Js::FunctionBody* functionBody, ByteCodeReader* reader, int currentOffset, int* nextStatementOffset)
    {
        int originalCurrentOffset = currentOffset;
        while (GetNextUserStatementOffsetHelper(functionBody, currentOffset, FunctionBody::SAT_FromCurrentToNext, nextStatementOffset))
        {
            Js::DebuggerScope *debuggerScope = functionBody->GetDiagCatchScopeObjectAt(currentOffset);
            if (debuggerScope != nullptr && !debuggerScope->IsOffsetInScope(*nextStatementOffset))
            {
                // Our next statement is not within this catch block, So we cannot just jump to it, we need to return false so the stack unwind will happen.
                return false;
            }

            Assert(currentOffset < *nextStatementOffset);

            if (IsTmpRegCountIncreased(functionBody, reader, originalCurrentOffset, *nextStatementOffset, true /*restoreOffset*/))
            {
                currentOffset = *nextStatementOffset;
            }
            else
            {
                return true;
            }
        }

        return false;
    }